

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O0

void __thiscall
sjtu::TrainManager::query_transfer_cmp<sjtu::cmp_time>
          (void *param_1,string *param_2,timeType *param_3)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  pair<unsigned_int,_bool> pVar5;
  void *pvVar6;
  ostream *poVar7;
  long lVar8;
  trainType *train_;
  uint v_;
  int id_;
  uint v;
  int k;
  int stationNum;
  int j;
  bool flag;
  pair<sjtu::recordType,_sjtu::recordType> cur;
  int day_id;
  trainType *train;
  locType offset;
  uint w_;
  int id;
  uint w;
  int i;
  bool found;
  pair<sjtu::recordType,_sjtu::recordType> ans;
  uint bits [3] [512];
  pair<unsigned_int,_bool> ret_t;
  pair<unsigned_int,_bool> ret_s;
  type in_stack_ffffffffffffe368;
  pair<sjtu::recordType,_sjtu::recordType> *in_stack_ffffffffffffe370;
  pair<sjtu::recordType,_sjtu::recordType> *in_stack_ffffffffffffe380;
  pair<sjtu::recordType,_sjtu::recordType> *in_stack_ffffffffffffe388;
  undefined6 in_stack_ffffffffffffe390;
  undefined1 in_stack_ffffffffffffe396;
  undefined1 in_stack_ffffffffffffe397;
  timeType *in_stack_ffffffffffffe398;
  pair<unsigned_int,_bool> in_stack_ffffffffffffe3a0;
  BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>
  *in_stack_ffffffffffffe3a8;
  trainType *in_stack_ffffffffffffe3b0;
  string *this;
  recordType *record;
  undefined8 local_1bb0;
  undefined8 local_1ba8;
  long local_1ba0;
  timeType *local_1b98;
  uint local_1b8c;
  int local_1b88;
  uint local_1b84;
  int local_1b80;
  allocator local_1b79;
  string local_1b78 [32];
  hashType local_1b58;
  uint local_1b4c;
  undefined1 local_1b48;
  undefined8 local_1b44;
  undefined8 local_1b3c;
  undefined4 local_1b34;
  int local_1b30;
  byte local_1b29;
  string local_1b28 [32];
  string local_1b08 [32];
  string local_1ae8 [32];
  undefined8 local_1ac8;
  undefined8 local_1ac0;
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  int local_1aa8;
  int local_1aa4;
  int local_1aa0;
  string local_1a98 [32];
  string local_1a78 [8];
  uint *in_stack_ffffffffffffe590;
  uint in_stack_ffffffffffffe59c;
  TrainManager *in_stack_ffffffffffffe5a0;
  string local_1a58 [32];
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  string local_1a08 [36];
  int local_19e4;
  pair<sjtu::recordType,_sjtu::recordType> *local_19e0;
  long local_19d8;
  uint local_19cc;
  int local_19c8;
  uint local_19c4;
  int local_19c0;
  byte local_19b9;
  uint local_1898 [512];
  uint auStack_1098 [512];
  uint local_898 [514];
  string local_90 [32];
  hashType local_70;
  uint local_64;
  byte local_60;
  string local_50 [32];
  hashType local_30;
  uint local_28;
  byte local_24;
  timeType *local_20;
  string *local_18;
  void *local_10;
  
  local_20 = param_3;
  local_18 = param_2;
  local_10 = param_1;
  std::__cxx11::string::string(local_50,param_2);
  local_30 = StringHasher::operator()
                       ((StringHasher *)in_stack_ffffffffffffe3a0,
                        (string *)in_stack_ffffffffffffe398);
  pVar5 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::find
                    (in_stack_ffffffffffffe3a8,(unsigned_long_long *)in_stack_ffffffffffffe3a0);
  local_28 = pVar5.first;
  local_24 = pVar5.second;
  std::__cxx11::string::~string(local_50);
  record = *param_1;
  this = local_90;
  std::__cxx11::string::string(this,local_18 + 0x20);
  local_70 = StringHasher::operator()
                       ((StringHasher *)in_stack_ffffffffffffe3a0,
                        (string *)in_stack_ffffffffffffe398);
  pVar5 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::find
                    (in_stack_ffffffffffffe3a8,(unsigned_long_long *)in_stack_ffffffffffffe3a0);
  local_64 = pVar5.first;
  local_60 = pVar5.second;
  std::__cxx11::string::~string(local_90);
  if (((local_24 & 1) == 0) || ((local_60 & 1) == 0)) {
    pvVar6 = (void *)std::ostream::operator<<(&std::cout,0);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  }
  else {
    bitset_query(in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe59c,in_stack_ffffffffffffe590);
    bitset_query(in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe59c,in_stack_ffffffffffffe590);
    std::pair<sjtu::recordType,_sjtu::recordType>::pair<sjtu::recordType,_sjtu::recordType,_true>
              ((pair<sjtu::recordType,_sjtu::recordType> *)
               CONCAT17(in_stack_ffffffffffffe397,
                        CONCAT16(in_stack_ffffffffffffe396,in_stack_ffffffffffffe390)));
    local_19b9 = 0;
    for (local_19c0 = 0; local_19c0 < 0x200; local_19c0 = local_19c0 + 1) {
      while (local_1898[local_19c0] != 0) {
        local_19c4 = local_1898[local_19c0] & -local_1898[local_19c0];
        if (local_19c4 != 0) {
          local_19c8 = -1;
          for (local_19cc = local_19c4; local_19cc != 0; local_19cc = local_19cc >> 1) {
            local_19c8 = local_19c8 + 1;
          }
          local_19d8 = (long)(local_19c0 * 0x20 + 1 + local_19c8) * 0xa7a8;
          local_19e0 = (pair<sjtu::recordType,_sjtu::recordType> *)
                       (**(code **)(**(long **)((long)param_1 + 0x20) + 0x10))
                                 (*(long **)((long)param_1 + 0x20),&local_19d8);
          iVar3 = timeType::dateminus(param_3,(timeType *)&local_19e0[0x94].second.field_0x58);
          std::__cxx11::string::string(local_1a08,local_18);
          iVar4 = trainType::get_Delta_date
                            (in_stack_ffffffffffffe3b0,(string *)in_stack_ffffffffffffe3a8);
          iVar3 = iVar3 + iVar4;
          std::__cxx11::string::~string(local_1a08);
          local_19e4 = iVar3;
          if ((((local_19e0[0x94].second.duration & 0x100) != 0) && (-1 < iVar3)) &&
             (iVar4 = timeType::dateminus((timeType *)&local_19e0[0x94].second.time[0].hour,
                                          (timeType *)&local_19e0[0x94].second.field_0x58),
             iVar3 <= iVar4)) {
            std::pair<sjtu::recordType,_sjtu::recordType>::
            pair<sjtu::recordType,_sjtu::recordType,_true>
                      ((pair<sjtu::recordType,_sjtu::recordType> *)
                       CONCAT17(in_stack_ffffffffffffe397,
                                CONCAT16(in_stack_ffffffffffffe396,in_stack_ffffffffffffe390)));
            std::__cxx11::string::operator=(local_1b28,(char *)local_19e0);
            std::__cxx11::string::operator=(local_1b08,local_18);
            local_1ac8._0_4_ = local_19e0[0x94].second.time[1].hour;
            local_1ac8._4_4_ = local_19e0[0x94].second.time[1].minute;
            local_1ac0._0_4_ = local_19e0[0x94].second.price;
            local_1ac0._4_4_ = local_19e0[0x94].second.seat;
            local_1aa4 = 100000;
            local_1aa8 = 0;
            local_1aa0 = 0;
            local_1b29 = 0;
            local_1b30 = 0;
            local_1b34 = *(undefined4 *)&(local_19e0->first).field_0x18;
            local_1ab8 = local_1ac8;
            uStack_1ab0 = local_1ac0;
            for (; local_1b30 < *(int *)&(local_19e0->first).field_0x18; local_1b30 = local_1b30 + 1
                ) {
              local_19e0 = (pair<sjtu::recordType,_sjtu::recordType> *)
                           (**(code **)(**(long **)((long)param_1 + 0x20) + 0x10))
                                     (*(long **)((long)param_1 + 0x20),&local_19d8);
              if (local_1b30 != 0) {
                timeType::operator+(in_stack_ffffffffffffe398,
                                    (int *)CONCAT17(in_stack_ffffffffffffe397,
                                                    CONCAT16(in_stack_ffffffffffffe396,
                                                             in_stack_ffffffffffffe390)));
                local_1ab8 = local_1b44;
                uStack_1ab0 = local_1b3c;
                local_1aa0 = (uint)(local_1b29 & 1) *
                             *(int *)((long)local_19e0 + (long)local_1b30 * 0x1a8 + 0x1c4) +
                             local_1aa0;
              }
              if ((local_1b29 & 1) != 0) {
                std::__cxx11::string::operator=
                          (local_1ae8,(char *)((long)local_19e0 + 0x20 + (long)local_1b30 * 0x1a8));
                local_1aa4 = min<int>(&local_1aa4,
                                      (int *)((long)local_19e0 + (long)local_1b30 * 0x1a8 + 0x4c +
                                             (long)local_19e4 * 4));
                local_1aa8 = local_1aa8 +
                             *(int *)((long)local_19e0 + 0x1bc + (long)local_1b30 * 0x1a8);
                in_stack_ffffffffffffe3a8 = *param_1;
                in_stack_ffffffffffffe3b0 = (trainType *)((long)param_1 + 0x10);
                lVar8 = (long)local_1b30;
                lVar1 = (long)local_19e0 + 0x20;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_1b78,(char *)(lVar1 + lVar8 * 0x1a8),&local_1b79)
                ;
                local_1b58 = StringHasher::operator()
                                       ((StringHasher *)in_stack_ffffffffffffe3a0,
                                        (string *)in_stack_ffffffffffffe398);
                in_stack_ffffffffffffe3a0 =
                     BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>
                     ::find(in_stack_ffffffffffffe3a8,
                            (unsigned_long_long *)in_stack_ffffffffffffe3a0);
                local_1b4c = in_stack_ffffffffffffe3a0.first;
                local_1b48 = in_stack_ffffffffffffe3a0.second;
                bitset_query(in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe59c,
                             in_stack_ffffffffffffe590);
                std::__cxx11::string::~string(local_1b78);
                std::allocator<char>::~allocator((allocator<char> *)&local_1b79);
                for (local_1b80 = 0; local_1b80 < 0x200; local_1b80 = local_1b80 + 1) {
                  local_898[local_1b80] = auStack_1098[local_1b80] & local_898[local_1b80];
                  while (local_898[local_1b80] != 0) {
                    local_1b84 = local_898[local_1b80] & -local_898[local_1b80];
                    if (local_1b84 != 0) {
                      local_1b88 = -1;
                      for (local_1b8c = local_1b84; local_1b8c != 0; local_1b8c = local_1b8c >> 1) {
                        local_1b88 = local_1b88 + 1;
                      }
                      local_1ba0 = (long)(local_1b80 * 0x20 + 1 + local_1b88) * 0xa7a8;
                      in_stack_ffffffffffffe398 =
                           (timeType *)
                           (**(code **)(**(long **)((long)param_1 + 0x20) + 0x10))
                                     (*(long **)((long)param_1 + 0x20),&local_1ba0);
                      local_1b98 = in_stack_ffffffffffffe398;
                      bVar2 = std::operator==((char *)in_stack_ffffffffffffe370,
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)in_stack_ffffffffffffe368);
                      if (!bVar2) {
                        std::__cxx11::string::operator=(local_1a78,local_1ae8);
                        std::__cxx11::string::operator=(local_1a58,local_18 + 0x20);
                        std::__cxx11::string::operator=(local_1a98,(char *)local_1b98);
                        local_1a38 = local_1ab8;
                        uStack_1a30 = uStack_1ab0;
                        in_stack_ffffffffffffe397 =
                             trainType::getrecord
                                       ((trainType *)pVar5,record,SUB81((ulong)this >> 0x38,0));
                        if (((bool)in_stack_ffffffffffffe397) &&
                           (((local_19b9 & 1) == 0 ||
                            (in_stack_ffffffffffffe396 =
                                  cmp_time::operator()
                                            ((cmp_time *)
                                             CONCAT17(in_stack_ffffffffffffe397,
                                                      CONCAT16(in_stack_ffffffffffffe396,
                                                               in_stack_ffffffffffffe390)),
                                             in_stack_ffffffffffffe388,in_stack_ffffffffffffe380),
                            (bool)in_stack_ffffffffffffe396)))) {
                          std::pair<sjtu::recordType,_sjtu::recordType>::operator=
                                    (in_stack_ffffffffffffe370,in_stack_ffffffffffffe368);
                          local_19b9 = 1;
                        }
                      }
                    }
                    local_898[local_1b80] = local_1b84 ^ local_898[local_1b80];
                  }
                }
              }
              in_stack_ffffffffffffe388 =
                   (pair<sjtu::recordType,_sjtu::recordType> *)
                   (**(code **)(**(long **)((long)param_1 + 0x20) + 0x10))
                             (*(long **)((long)param_1 + 0x20),&local_19d8);
              local_19e0 = in_stack_ffffffffffffe388;
              if (local_1b30 != 0) {
                timeType::operator+(in_stack_ffffffffffffe398,
                                    (int *)CONCAT17(in_stack_ffffffffffffe397,
                                                    CONCAT16(in_stack_ffffffffffffe396,
                                                             in_stack_ffffffffffffe390)));
                local_1ab8 = local_1bb0;
                uStack_1ab0 = local_1ba8;
                local_1aa0 = (uint)(local_1b29 & 1) *
                             *(int *)((long)local_19e0 + (long)local_1b30 * 0x1a8 + 0x1c0) +
                             local_1aa0;
              }
              bVar2 = std::operator==((char *)in_stack_ffffffffffffe370,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffe368);
              if (bVar2) {
                local_1b29 = 1;
                local_1ac0 = uStack_1ab0;
                local_1ab8._0_4_ = param_3->month;
                local_1ab8._4_4_ = param_3->day;
                local_1ac8._0_4_ = param_3->month;
                local_1ac8._4_4_ = param_3->day;
              }
            }
            std::pair<sjtu::recordType,_sjtu::recordType>::~pair(in_stack_ffffffffffffe370);
          }
        }
        local_1898[local_19c0] = local_19c4 ^ local_1898[local_19c0];
      }
    }
    if ((local_19b9 & 1) == 0) {
      pvVar6 = (void *)std::ostream::operator<<(&std::cout,0);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar7 = operator<<((ostream *)in_stack_ffffffffffffe370,&in_stack_ffffffffffffe368->first);
      in_stack_ffffffffffffe370 =
           (pair<sjtu::recordType,_sjtu::recordType> *)
           std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = operator<<((ostream *)in_stack_ffffffffffffe370,&in_stack_ffffffffffffe368->first);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    std::pair<sjtu::recordType,_sjtu::recordType>::~pair(in_stack_ffffffffffffe370);
  }
  return;
}

Assistant:

void query_transfer_cmp(std::string station[] , timeType date , Compare comp)
		{
			auto ret_s = StationBpTree -> find(hasher(station[0])) , ret_t = StationBpTree -> find(hasher(station[1]));
			if (ret_s.second == false || ret_t.second == false) std::cout << 0 << std::endl;
			else
			{
				unsigned int bits[3][WS];		
				bitset_query(ret_s.first , bits[0]) , bitset_query(ret_t.first , bits[1]);
				std::pair<recordType , recordType> ans;bool found = false;
				for (int i = 0;i < WS;++ i)
					for (unsigned int w;bits[0][i];bits[0][i] ^= w)
					{
						w = bits[0][i] & (-bits[0][i]);
						if (!w) continue;
						int id = -1;
						for (unsigned int w_ = w;w_;w_ >>= 1) ++ id;
						locType offset = (i * W + id + 1) * sizeof (DynamicFileManager<trainType>::valueType);
						trainType *train = TrainFile -> read(offset);
						int day_id = timeType::dateminus(date , train -> saleDate[0]) + train -> get_Delta_date(station[0]);
						if (train -> is_released == false || day_id < 0 || day_id > timeType::dateminus(train -> saleDate[1] , train -> saleDate[0])) continue;
						std::pair<recordType , recordType> cur;
						cur.first.trainID = train -> trainID , cur.first.station[0] = station[0] , cur.first.time[0] = cur.first.time[1] = train -> startTime;
						cur.first.seat = 100000 , cur.first.price = 0 , cur.first.duration = 0;
						bool flag = false;
						for (int j = 0 , stationNum = train -> stationNum;j < train -> stationNum;++ j)
						{
							train = TrainFile -> read(offset);
							if (j) cur.first.time[1] = cur.first.time[1] + train -> stations[j].travelTime , cur.first.duration += flag * (train -> stations[j].travelTime);
							if (flag)
							{
								cur.first.station[1] = train -> stations[j].stationName;
								cur.first.seat = min(cur.first.seat , train -> stations[j].seatNum[day_id]) , cur.first.price += train -> stations[j].price;
								bitset_query(StationBpTree -> find(hasher(train -> stations[j].stationName)).first , bits[2]);
								for (int k = 0;k < WS;++ k)
								{
									bits[2][k] &= bits[1][k];
									for (unsigned int v;bits[2][k];bits[2][k] ^= v)
									{
										v = bits[2][k] & (-bits[2][k]);
										if (!v) continue;
										int id_ = -1;
										for (unsigned int v_ = v;v_;v_ >>= 1) ++ id_;
										trainType *train_ = TrainFile -> read((k * W + id_ + 1) * sizeof (DynamicFileManager<trainType>::valueType));
										if (train_ -> trainID == cur.first.trainID) continue;
										cur.second.station[0] = cur.first.station[1] , cur.second.station[1] = station[1];
										cur.second.trainID = train_ -> trainID , cur.second.time[0] = cur.first.time[1];
										if (train_ -> getrecord(&cur.second , true)) if (!found || comp(cur , ans)) ans = cur , found = true;
									}
								}
							}
							train = TrainFile -> read(offset);
							if (j) cur.first.time[1] = cur.first.time[1] + train -> stations[j].stopoverTime , cur.first.duration += flag * (train -> stations[j].stopoverTime);
							if (train -> stations[j].stationName == station[0])
							{
								flag = true;
								cur.first.time[1].month = cur.first.time[0].month = date.month;
								cur.first.time[0].hour = cur.first.time[1].hour , cur.first.time[0].minute = cur.first.time[1].minute;
								cur.first.time[1].day = cur.first.time[0].day = date.day;
							}
						}
					}
				if (!found) std::cout << 0 << std::endl;
				else std::cout << ans.first << std::endl << ans.second << std::endl;
			}
		}